

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ScaleLayerParams::SerializeWithCachedSizes
          (ScaleLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  int local_28;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ScaleLayerParams *this_local;
  
  iVar2 = shapescale_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shapescale_cached_byte_size_);
  }
  i_1 = 0;
  iVar2 = shapescale_size(this);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    uVar3 = shapescale(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  bVar1 = has_scale(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->scale_->super_MessageLite,output);
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    bVar1 = hasbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  iVar2 = shapebias_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(4,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shapebias_cached_byte_size_);
  }
  local_28 = 0;
  iVar2 = shapebias_size(this);
  for (; local_28 < iVar2; local_28 = local_28 + 1) {
    uVar3 = shapebias(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&this->bias_->super_MessageLite,output);
  }
  return;
}

Assistant:

void ScaleLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ScaleLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 shapeScale = 1;
  if (this->shapescale_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shapescale_cached_byte_size_);
  }
  for (int i = 0, n = this->shapescale_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->shapescale(i), output);
  }

  // .CoreML.Specification.WeightParams scale = 2;
  if (this->has_scale()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->scale_, output);
  }

  // bool hasBias = 3;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->hasbias(), output);
  }

  // repeated uint64 shapeBias = 4;
  if (this->shapebias_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shapebias_cached_byte_size_);
  }
  for (int i = 0, n = this->shapebias_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->shapebias(i), output);
  }

  // .CoreML.Specification.WeightParams bias = 5;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *this->bias_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ScaleLayerParams)
}